

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder.c
# Opt level: O1

void tag_nbviterbi(mdl_t *mdl,seq_t *seq,uint32_t N,uint32_t **out,double *sc,double **psc)

{
  double *pdVar1;
  uint uVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  void *pvVar6;
  ulong uVar7;
  seq_t *psVar8;
  void *pvVar9;
  ulong uVar10;
  mdl_t *pmVar11;
  ulong uVar12;
  undefined1 *puVar13;
  int iVar14;
  ulong uVar15;
  uint32_t uVar16;
  mdl_t *pmVar17;
  ulong uVar18;
  mdl_t *pmVar19;
  uint uVar20;
  ulong uVar21;
  long lVar22;
  ulong uVar23;
  long lVar24;
  size_t size;
  undefined1 auVar25 [16];
  double dVar26;
  undefined1 auVar27 [16];
  undefined1 auVar29 [16];
  undefined1 auStack_d8 [8];
  undefined1 *local_d0;
  double *local_c8;
  ulong local_c0;
  ulong local_b8;
  void *local_b0;
  long local_a8;
  long local_a0;
  double **local_98;
  double *local_90;
  uint32_t **local_88;
  void *local_80;
  long local_78;
  ulong local_70;
  ulong local_68;
  void *local_60;
  mdl_t *local_58;
  mdl_t *local_50;
  ulong local_48;
  double *local_40;
  seq_t *local_38;
  long lVar28;
  
  puVar13 = auStack_d8;
  uVar20 = mdl->nlbl;
  local_48 = (ulong)uVar20;
  uVar2 = seq->len;
  local_98 = psc;
  local_90 = sc;
  local_88 = out;
  local_58 = mdl;
  local_38 = seq;
  local_40 = xvm_new((ulong)(uVar20 * uVar20 * uVar2));
  uVar23 = (ulong)N;
  lVar24 = uVar23 * (long)(ulong)uVar20;
  local_68 = (ulong)uVar2;
  local_50 = (mdl_t *)(ulong)uVar20;
  local_60 = xmalloc(lVar24 * (ulong)uVar2 * 4);
  size = lVar24 * 8;
  psVar8 = (seq_t *)xmalloc(size);
  pvVar9 = xmalloc(size);
  if (local_58->type == 1) {
    tag_memmsc(local_58,local_38,local_40);
  }
  else {
    if (local_58->opt->lblpost != true) {
      tag_expsc(local_58,local_38,local_40);
      iVar14 = 0;
      bVar3 = true;
      goto LAB_00107617;
    }
    tag_postsc(local_58,local_38,local_40);
  }
  iVar14 = 1;
  bVar3 = false;
LAB_00107617:
  if (local_58->opt->force == true) {
    tag_forced(local_58,local_38,local_40,iVar14);
  }
  uVar21 = (ulong)((int)local_48 * N);
  if (local_50 != (mdl_t *)0x0) {
    pmVar11 = (mdl_t *)0x0;
    uVar10 = 0;
    do {
      uVar15 = (ulong)((int)uVar10 + 1);
      *(double *)((long)psVar8 + uVar10 * 8) = local_40[(long)pmVar11];
      iVar14 = N - 1;
      if (1 < N) {
        do {
          *(undefined8 *)((long)psVar8 + uVar15 * 8) = 0xffefffffffffffff;
          uVar15 = (ulong)((int)uVar15 + 1);
          iVar14 = iVar14 + -1;
        } while (iVar14 != 0);
      }
      pmVar11 = (mdl_t *)((long)&pmVar11->opt + 1);
      uVar10 = uVar15;
    } while (pmVar11 != local_50);
  }
  auVar5 = _DAT_001120c0;
  auVar4 = _DAT_001120b0;
  local_48 = uVar21;
  local_38 = psVar8;
  if (1 < (uint)local_68) {
    local_a0 = (long)local_50 * (long)local_50;
    local_c0 = uVar23 + 1 & 0xfffffffffffffffe;
    lVar24 = uVar23 - 1;
    auVar25._8_4_ = (int)lVar24;
    auVar25._0_8_ = lVar24;
    auVar25._12_4_ = (int)((ulong)lVar24 >> 0x20);
    local_a8 = uVar21 * 4;
    local_80 = (void *)((long)local_60 + uVar21 * 4);
    local_78 = (long)local_60 + uVar21 * 4 + 4;
    local_70 = 1;
    local_b8 = uVar21 * 8 + 0xf & 0xfffffffffffffff0;
    auVar25 = auVar25 ^ _DAT_001120c0;
    pmVar11 = local_50;
    puVar13 = auStack_d8;
    do {
      if (uVar21 != 0) {
        uVar10 = 0;
        do {
          *(undefined8 *)((long)pvVar9 + uVar10 * 8) = *(undefined8 *)((long)psVar8 + uVar10 * 8);
          uVar10 = uVar10 + 1;
        } while (uVar21 != uVar10);
      }
      if (pmVar11 != (mdl_t *)0x0) {
        local_c8 = local_40 + local_a0 * local_70;
        local_b0 = (void *)((long)local_60 + local_70 * uVar21 * 4);
        uVar10 = 0;
        pmVar17 = (mdl_t *)0x0;
        do {
          pvVar6 = local_80;
          uVar21 = local_b8;
          pdVar1 = local_c8;
          local_d0 = puVar13;
          lVar24 = (uVar10 & 0xffffffff) * 4;
          lVar22 = lVar24 + local_78;
          local_58 = pmVar17;
          pmVar19 = (mdl_t *)0x0;
          uVar20 = 0;
          do {
            if (N != 0) {
              uVar16 = N;
              do {
                uVar15 = (ulong)uVar20;
                dVar26 = *(double *)((long)pvVar9 + uVar15 * 8);
                *(double *)(puVar13 + (uVar15 * 8 - uVar21)) = dVar26;
                if (bVar3) {
                  dVar26 = dVar26 + pdVar1[(long)((long)&pmVar17->opt +
                                                 (long)pmVar19 * (long)pmVar11)];
                }
                else {
                  dVar26 = dVar26 * pdVar1[(long)((long)&pmVar17->opt +
                                                 (long)pmVar19 * (long)pmVar11)];
                }
                *(double *)(puVar13 + (uVar15 * 8 - uVar21)) = dVar26;
                uVar20 = uVar20 + 1;
                uVar16 = uVar16 - 1;
              } while (uVar16 != 0);
            }
            pmVar19 = (mdl_t *)((long)&pmVar19->opt + 1);
          } while (pmVar19 != pmVar11);
          if (N != 0) {
            uVar15 = 0;
            auVar27 = auVar4;
            do {
              auVar29 = auVar27 ^ auVar5;
              if ((bool)(~(auVar25._4_4_ < auVar29._4_4_ ||
                          auVar25._0_4_ < auVar29._0_4_ && auVar29._4_4_ == auVar25._4_4_) & 1)) {
                *(int *)((long)pvVar6 + uVar15 * 4 + lVar24) = (int)uVar15;
              }
              if (auVar29._12_4_ <= auVar25._12_4_ &&
                  (auVar29._8_4_ <= auVar25._8_4_ || auVar29._12_4_ != auVar25._12_4_)) {
                *(int *)((long)pvVar6 + uVar15 * 4 + lVar24 + 4) = (int)uVar15 + 1;
              }
              uVar15 = uVar15 + 2;
              lVar28 = auVar27._8_8_;
              auVar27._0_8_ = auVar27._0_8_ + 2;
              auVar27._8_8_ = lVar28 + 2;
            } while (local_c0 != uVar15);
          }
          if (N < (uint)local_48) {
            uVar20 = (int)local_58 * N;
            uVar15 = uVar23;
            do {
              if (N < 2) {
                uVar12 = 0;
              }
              else {
                uVar12 = 0;
                uVar18 = 1;
                do {
                  uVar7 = uVar18 & 0xffffffff;
                  if (*(double *)
                       (puVar13 +
                       ((ulong)*(uint *)((long)local_b0 + uVar12 * 4 + (ulong)uVar20 * 4) * 8 -
                       uVar21)) <
                      *(double *)
                       (puVar13 + ((ulong)*(uint *)(lVar22 + -4 + uVar18 * 4) * 8 - uVar21)) ||
                      *(double *)
                       (puVar13 +
                       ((ulong)*(uint *)((long)local_b0 + uVar12 * 4 + (ulong)uVar20 * 4) * 8 -
                       uVar21)) ==
                      *(double *)
                       (puVar13 + ((ulong)*(uint *)(lVar22 + -4 + uVar18 * 4) * 8 - uVar21))) {
                    uVar7 = uVar12;
                  }
                  uVar12 = uVar7;
                  uVar18 = uVar18 + 1;
                } while (uVar23 != uVar18);
              }
              if (*(double *)
                   (puVar13 +
                   ((ulong)*(uint *)((long)local_b0 + uVar12 * 4 + (ulong)uVar20 * 4) * 8 - uVar21))
                  <= *(double *)(puVar13 + (uVar15 * 8 - uVar21)) &&
                  *(double *)(puVar13 + (uVar15 * 8 - uVar21)) !=
                  *(double *)
                   (puVar13 +
                   ((ulong)*(uint *)((long)local_b0 + uVar12 * 4 + (ulong)uVar20 * 4) * 8 - uVar21))
                 ) {
                *(int *)((long)local_b0 + uVar12 * 4 + (ulong)uVar20 * 4) = (int)uVar15;
              }
              uVar15 = uVar15 + 1;
            } while (uVar15 != local_48);
          }
          if (N != 0) {
            uVar15 = 0;
            do {
              *(undefined8 *)((long)local_38 + (ulong)(uint)((int)uVar10 + (int)uVar15) * 8) =
                   *(undefined8 *)
                    (puVar13 + ((ulong)*(uint *)((long)pvVar6 + uVar15 * 4 + lVar24) * 8 - uVar21));
              uVar15 = uVar15 + 1;
            } while (uVar23 != uVar15);
          }
          pmVar17 = (mdl_t *)((long)&local_58->opt + 1);
          uVar10 = uVar10 + uVar23;
          pmVar11 = local_50;
          psVar8 = local_38;
          puVar13 = local_d0;
          uVar21 = local_48;
        } while (pmVar17 != local_50);
      }
      local_70 = local_70 + 1;
      local_80 = (void *)((long)local_80 + local_a8);
      local_78 = local_78 + local_a8;
    } while (local_70 != local_68);
  }
  if (N == 0) {
LAB_00107a6e:
    *(undefined8 *)(puVar13 + -8) = 0x107a76;
    free(pvVar9);
    psVar8 = local_38;
    *(undefined8 *)(puVar13 + -8) = 0x107a7f;
    free(psVar8);
    pvVar9 = local_60;
    *(undefined8 *)(puVar13 + -8) = 0x107a88;
    free(pvVar9);
    xvm_free(local_40);
    return;
  }
  uVar10 = 0;
LAB_0010797c:
  uVar15 = 0;
  if (1 < (uint)uVar21) {
    uVar18 = 1;
    uVar12 = 0;
    do {
      dVar26 = *(double *)((long)local_38 + uVar18 * 8);
      pdVar1 = (double *)((long)local_38 + uVar12 * 8);
      uVar15 = uVar18 & 0xffffffff;
      if (dVar26 < *pdVar1 || dVar26 == *pdVar1) {
        uVar15 = uVar12;
      }
      uVar18 = uVar18 + 1;
      uVar12 = uVar15;
    } while (uVar21 != uVar18);
  }
  if (local_90 != (double *)0x0) {
    local_90[uVar10] = *(double *)((long)local_38 + uVar15 * 8);
  }
  *(undefined8 *)((long)local_38 + uVar15 * 8) = 0xffefffffffffffff;
  uVar21 = local_68;
  do {
    iVar14 = (int)uVar21;
    if (iVar14 == 1) {
      uVar12 = 0;
    }
    else {
      if (iVar14 == 0) break;
      uVar12 = (ulong)*(uint *)((long)local_60 + uVar15 * 4 + (iVar14 - 1) * local_48 * 4) /
               (ulong)N;
    }
    uVar21 = (ulong)(iVar14 - 1);
    local_88[uVar21][uVar10] = (uint32_t)(uVar15 / N);
    if (local_98 != (double **)0x0) {
      local_98[uVar21][uVar10] =
           local_40[(long)local_50 * (long)local_50 * uVar21 + uVar12 * (long)local_50 + uVar15 / N]
      ;
    }
    uVar15 = (ulong)*(uint *)((long)local_60 + uVar15 * 4 + uVar21 * local_48 * 4);
  } while( true );
  uVar10 = uVar10 + 1;
  uVar21 = local_48;
  if (uVar10 == uVar23) goto LAB_00107a6e;
  goto LAB_0010797c;
}

Assistant:

void tag_nbviterbi(mdl_t *mdl, const seq_t *seq, uint32_t N,
                   uint32_t **out, double sc[], double **psc) {
	const uint32_t Y = mdl->nlbl;
	const uint32_t T = seq->len;
	double   *vpsi  = xvm_new(T * Y * Y);
	uint32_t *vback = xmalloc(sizeof(uint32_t) * T * Y * N);
	double   (*psi) [T][Y    ][Y] = (void *)vpsi;
	uint32_t (*back)[T][Y * N]    = (void *)vback;
	double *cur = xmalloc(sizeof(double) * Y * N);
	double *old = xmalloc(sizeof(double) * Y * N);
	// We first compute the scores for each transitions in the lattice of
	// labels.
	int op;
	if (mdl->type == 1)
		op = tag_memmsc(mdl, seq, vpsi);
	else if (mdl->opt->lblpost)
		op = tag_postsc(mdl, seq, (double *)psi);
	else
		op = tag_expsc(mdl, seq, (double *)psi);
	if (mdl->opt->force)
		tag_forced(mdl, seq, vpsi, op);
	// Here also, it's classical but we have to keep the N best paths
	// leading to each nodes of the lattice instead of only the best one.
	// This mean that code is less trivial and the current implementation is
	// not the most efficient way to do this but it works well and is good
	// enough for the moment.
	// We first build the list of all incoming arcs from all paths from all
	// N-best nodes and next select the N-best one. There is a lot of room
	// here for later optimisations if needed.
	for (uint32_t y = 0, d = 0; y < Y; y++) {
		cur[d++] = (*psi)[0][0][y];
		for (uint32_t n = 1; n < N; n++)
			cur[d++] = -DBL_MAX;
	}
	for (uint32_t t = 1; t < T; t++) {
		for (uint32_t d = 0; d < Y * N; d++)
			old[d] = cur[d];
		for (uint32_t y = 0; y < Y; y++) {
			// 1st, build the list of all incoming
			double lst[Y * N];
			for (uint32_t yp = 0, d = 0; yp < Y; yp++) {
				for (uint32_t n = 0; n < N; n++, d++) {
					lst[d] = old[d];
					if (op)
						lst[d] *= (*psi)[t][yp][y];
					else
						lst[d] += (*psi)[t][yp][y];
				}
			}
			// 2nd, init the back with the N first
			uint32_t *bk = &(*back)[t][y * N];
			for (uint32_t n = 0; n < N; n++)
				bk[n] = n;
			// 3rd, search the N highest values
			for (uint32_t i = N; i < N * Y; i++) {
				// Search the smallest current value
				uint32_t idx = 0;
				for (uint32_t n = 1; n < N; n++)
					if (lst[bk[n]] < lst[bk[idx]])
						idx = n;
				// And replace it if needed
				if (lst[i] > lst[bk[idx]])
					bk[idx] = i;
			}
			// 4th, get the new scores
			for (uint32_t n = 0; n < N; n++)
				cur[y * N + n] = lst[bk[n]];
		}
	}
	// Retrieving the best paths is similar to classical Viterbi except that
	// we have to search for the N bet ones and there is N time more
	// possibles starts.
	for (uint32_t n = 0; n < N; n++) {
		uint32_t bst = 0;
		for (uint32_t d = 1; d < Y * N; d++)
			if (cur[d] > cur[bst])
				bst = d;
		if (sc != NULL)
			sc[n] = cur[bst];
		cur[bst] = -DBL_MAX;
		for (uint32_t t = T; t > 0; t--) {
			const uint32_t yp = (t != 1) ? (*back)[t - 1][bst] / N: 0;
			const uint32_t y  = bst / N;
			out[t - 1][n] = y;
			if (psc != NULL)
				psc[t - 1][n] = (*psi)[t - 1][yp][y];
			bst = (*back)[t - 1][bst];
		}
	}
	free(old);
	free(cur);
	free(vback);
	xvm_free(vpsi);
}